

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O0

int c_strreplace(char *src,size_t src_len,char *pattern,char *repl,int *str_replaced)

{
  long lVar1;
  size_t sVar2;
  size_t sVar3;
  size_t __n;
  char *in_RCX;
  char *in_RDX;
  ulong in_RSI;
  char *in_RDI;
  undefined4 *in_R8;
  size_t rl;
  size_t pl;
  size_t l;
  size_t of;
  char *p;
  size_t local_70;
  char *local_38;
  int local_4;
  
  local_38 = strstr(in_RDI,in_RDX);
  if (local_38 == (char *)0x0) {
    local_4 = -1;
  }
  else {
    do {
      lVar1 = (long)local_38 - (long)in_RDI;
      sVar2 = strlen(in_RDI);
      sVar3 = strlen(in_RDX);
      __n = strlen(in_RCX);
      local_70 = sVar3;
      if (sVar3 < __n) {
        local_70 = __n;
      }
      if (in_RSI <= sVar2 + local_70 + 1) {
        return -1;
      }
      if (__n != sVar3) {
        memmove(in_RDI + __n + lVar1,in_RDI + sVar3 + lVar1,((sVar2 - lVar1) - sVar3) + 1);
      }
      memcpy(in_RDI + lVar1,in_RCX,__n);
      if (in_R8 != (undefined4 *)0x0) {
        *in_R8 = 1;
      }
      local_38 = strstr(in_RDI,in_RDX);
    } while (local_38 != (char *)0x0);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int c_strreplace(char *src,
                        size_t src_len,
                        const char *pattern,
                        const char *repl,
                        int *str_replaced)
{
    char *p = NULL;

    p = strstr(src, pattern);
    if (p == NULL) {
        return -1;
    }

    do {
        size_t of = p - src;
        size_t l  = strlen(src);
        size_t pl = strlen(pattern);
        size_t rl = strlen(repl);

        /* overflow check */
        if (src_len <= l + MAX(pl, rl) + 1) {
            return -1;
        }

        if (rl != pl) {
            memmove(src + of + rl, src + of + pl, l - of - pl + 1);
        }

        memcpy(src + of, repl, rl);

        if (str_replaced != NULL) {
            *str_replaced = 1;
        }
        p = strstr(src, pattern);
    } while (p != NULL);

    return 0;
}